

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_while_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIP_node_push_child(G->val[-4],G->val[-2]);
  G->ss = G->val[-4];
  return;
}

Assistant:

YY_ACTION(void) yy_2_while_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define l G->val[-1]
#define b G->val[-2]
#define cond G->val[-3]
#define w G->val[-4]
  yyprintf((stderr, "do yy_2_while_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
                PVIP_node_push_child(w,b);\n\
                yy = w;\n\
            }\n"));
  
                PVIP_node_push_child(w,b);
                yy = w;
            ;
#undef l
#undef b
#undef cond
#undef w
}